

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FkRequired(Parse *pParse,Table *pTab,int *aChange,int chngRowid)

{
  int iVar1;
  FKey *pFVar2;
  bool local_39;
  FKey *local_38;
  FKey *p;
  int eRet;
  int chngRowid_local;
  int *aChange_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  p._0_4_ = 0;
  if ((pParse->db->flags & 0x4000) != 0) {
    if (aChange == (int *)0x0) {
      pFVar2 = sqlite3FkReferences(pTab);
      local_39 = true;
      if (pFVar2 == (FKey *)0x0) {
        local_39 = pTab->pFKey != (FKey *)0x0;
      }
      p._0_4_ = (uint)local_39;
    }
    else {
      for (local_38 = pTab->pFKey; local_38 != (FKey *)0x0; local_38 = local_38->pNextFrom) {
        iVar1 = sqlite3_stricmp(pTab->zName,local_38->zTo);
        if (iVar1 == 0) {
          return 2;
        }
        iVar1 = fkChildIsModified(pTab,local_38,aChange,chngRowid);
        if (iVar1 != 0) {
          p._0_4_ = 1;
        }
      }
      for (local_38 = sqlite3FkReferences(pTab); local_38 != (FKey *)0x0;
          local_38 = local_38->pNextTo) {
        iVar1 = fkParentIsModified(pTab,local_38,aChange,chngRowid);
        if (iVar1 != 0) {
          if (local_38->aAction[1] != '\0') {
            return 2;
          }
          p._0_4_ = 1;
        }
      }
    }
  }
  return (uint)p;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkRequired(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being modified */
  int *aChange,                   /* Non-NULL for UPDATE operations */
  int chngRowid                   /* True for UPDATE that affects rowid */
){
  int eRet = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    if( !aChange ){
      /* A DELETE operation. Foreign key processing is required if the 
      ** table in question is either the child or parent table for any 
      ** foreign key constraint.  */
      eRet = (sqlite3FkReferences(pTab) || pTab->pFKey);
    }else{
      /* This is an UPDATE. Foreign key processing is only required if the
      ** operation modifies one or more child or parent key columns. */
      FKey *p;

      /* Check if any child key columns are being modified. */
      for(p=pTab->pFKey; p; p=p->pNextFrom){
        if( 0==sqlite3_stricmp(pTab->zName, p->zTo) ) return 2;
        if( fkChildIsModified(pTab, p, aChange, chngRowid) ){
          eRet = 1;
        }
      }

      /* Check if any parent key columns are being modified. */
      for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
        if( fkParentIsModified(pTab, p, aChange, chngRowid) ){
          if( p->aAction[1]!=OE_None ) return 2;
          eRet = 1;
        }
      }
    }
  }
  return eRet;
}